

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

bool __thiscall kws::Parser::IsInAnyComments(Parser *this,size_t pos)

{
  ulong in_RSI;
  long in_RDI;
  size_t posstart;
  size_t posend;
  size_t posslash;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c52);
  local_28 = 0xffffffffffffffff;
  if (local_20 != 0xffffffffffffffff) {
    local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c2a);
  }
  while( true ) {
    if (local_28 == 0xffffffffffffffff) {
      local_30 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c55);
      local_28 = 0xffffffffffffffff;
      if (local_30 != 0xffffffffffffffff) {
        local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c58);
      }
      while( true ) {
        if (local_28 == 0xffffffffffffffff) {
          return false;
        }
        if ((in_RSI <= local_28) && (local_30 <= in_RSI)) break;
        local_30 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c55);
        if (local_30 == 0xffffffffffffffff) {
          local_28 = 0xffffffffffffffff;
        }
        else {
          local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c58);
        }
      }
      return true;
    }
    if ((in_RSI <= local_28) && (local_20 <= in_RSI)) break;
    local_20 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c52);
    if (local_20 == 0xffffffffffffffff) {
      local_28 = 0xffffffffffffffff;
    }
    else {
      local_28 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c2a);
    }
  }
  return true;
}

Assistant:

bool Parser::IsInAnyComments(size_t pos) const
{
  //Check //
  size_t posslash = m_Buffer.find("//",0);
  size_t posend = std::string::npos;
  if(posslash != std::string::npos)
    {
    posend = m_Buffer.find("\n",posslash);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posslash)
      {
      return true;
      }
    posslash = m_Buffer.find("//",posend+1);
    if(posslash != std::string::npos)
      {
      posend = m_Buffer.find("\n",posslash);
      }
    else
      {
      posend = std::string::npos;
      }
    }

  // Check the /* */
  size_t posstart = m_Buffer.find("/*",0);
  posend = std::string::npos;
  if(posstart != std::string::npos)
    {
    posend = m_Buffer.find("*/",posstart);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posstart)
      {
      return true;
      }
    posstart = m_Buffer.find("/*",posend+1);
    if(posstart != std::string::npos)
      {
      posend = m_Buffer.find("*/",posstart);
      }
    else
      {
      posend = std::string::npos;
      }
    }
  return false;
}